

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

bool sc_dt::operator==(uint64 u,sc_signed *v)

{
  sc_digit *psVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint64 uVar11;
  bool bVar12;
  sc_digit ud [3];
  uint auStack_1c [3];
  
  if (u == 0) {
    uVar8 = 0;
    bVar12 = true;
  }
  else {
    uVar4 = 0;
    uVar11 = u;
    do {
      auStack_1c[uVar4] = (uint)uVar11 & 0x3fffffff;
      uVar8 = uVar4 + 1;
      bVar12 = uVar4 < 2;
      if (!bVar12) break;
      bVar2 = 0x3fffffff < uVar11;
      uVar4 = uVar8;
      uVar11 = uVar11 >> 0x1e;
    } while (bVar2);
  }
  if (bVar12) {
    memset(auStack_1c + (uVar8 & 0xffffffff),0,(ulong)(2 - (int)uVar8) * 4 + 4);
  }
  if (v->sgn == (uint)(u != 0)) {
    uVar7 = v->ndigits;
    psVar1 = v->digit;
    uVar8 = 2;
    uVar3 = 4;
    do {
      if (uVar8 == 0xffffffffffffffff) {
        uVar3 = 0;
        break;
      }
      uVar4 = uVar8 & 0xffffffff;
      uVar8 = uVar8 - 1;
      uVar3 = uVar3 - 1;
    } while (auStack_1c[uVar4] == 0);
    uVar6 = (int)uVar7 >> 0x1f & uVar7;
    uVar9 = uVar7 + 1;
    do {
      uVar10 = uVar6;
      if ((int)uVar7 < 1) break;
      uVar7 = uVar7 - 1;
      uVar9 = uVar9 - 1;
      uVar10 = uVar9;
    } while (psVar1[uVar7] == 0);
    iVar5 = uVar3 - uVar10;
    if (iVar5 == 0) {
      uVar8 = (ulong)uVar3;
      do {
        uVar4 = uVar8;
        uVar7 = ((int)uVar3 >> 0x1f & uVar3) - 1;
        if ((long)uVar4 < 1) break;
        uVar8 = uVar4 - 1;
        uVar7 = (uint)uVar8;
      } while (auStack_1c[uVar8 & 0xffffffff] == psVar1[uVar8 & 0xffffffff]);
      if ((long)uVar4 < 1) {
        iVar5 = 0;
      }
      else {
        iVar5 = auStack_1c[uVar7] - psVar1[uVar7];
      }
    }
    bVar12 = iVar5 == 0;
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool
operator==(uint64 u, const sc_signed& v)
{

  CONVERT_INT64(u);

  if (us != v.sgn)
    return false;

  if (vec_skip_and_cmp(DIGITS_PER_INT64, ud, v.ndigits, v.digit) != 0)
    return false;

  return true;

}